

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

bool __thiscall
Js::VariableWalkerBase::IsPropertyValid
          (VariableWalkerBase *this,PropertyId propertyId,RegSlot location,
          bool *isPropertyInDebuggerScope,bool *isConst,bool *isInDeadZone)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  FunctionBody *this_00;
  ScopeObjectChain *pSVar6;
  int offset;
  FunctionBody *pFBody;
  bool *isInDeadZone_local;
  bool *isConst_local;
  bool *isPropertyInDebuggerScope_local;
  RegSlot location_local;
  PropertyId propertyId_local;
  VariableWalkerBase *this_local;
  
  if (isPropertyInDebuggerScope == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x1db,"(isPropertyInDebuggerScope)","isPropertyInDebuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (isConst == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0x1dc,"(isConst)","isConst");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  *isPropertyInDebuggerScope = false;
  *isConst = false;
  if (((this->allowLexicalThis & 1U) == 0) && ((propertyId == 0x2d5 || (propertyId == 0x2d8)))) {
    this_local._7_1_ = false;
  }
  else if (((this->allowSuperReference & 1U) == 0) &&
          ((propertyId == 0x2d6 || (propertyId == 0x2d7)))) {
    this_local._7_1_ = false;
  }
  else {
    BVar3 = IsInternalPropertyId(propertyId);
    if (BVar3 == 0) {
      if (this->pFrame == (DiagStackFrame *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x1f1,"(pFrame)","pFrame");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      iVar4 = (*this->pFrame->_vptr_DiagStackFrame[2])();
      this_00 = JavascriptFunction::GetFunctionBody
                          ((JavascriptFunction *)CONCAT44(extraout_var,iVar4));
      if ((this_00 != (FunctionBody *)0x0) &&
         (pSVar6 = FunctionBody::GetScopeObjectChain(this_00), pSVar6 != (ScopeObjectChain *)0x0)) {
        iVar4 = GetAdjustedByteCodeOffset(this);
        pSVar6 = FunctionBody::GetScopeObjectChain(this_00);
        bVar2 = ScopeObjectChain::TryGetDebuggerScopePropertyInfo
                          (pSVar6,propertyId,location,iVar4,isPropertyInDebuggerScope,isConst,
                           isInDeadZone);
        if (bVar2) {
          return true;
        }
      }
      this_local._7_1_ = (bool)((*isPropertyInDebuggerScope ^ 0xffU) & 1);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool VariableWalkerBase::IsPropertyValid(PropertyId propertyId, RegSlot location, bool *isPropertyInDebuggerScope, bool* isConst, bool* isInDeadZone) const
    {
        Assert(isPropertyInDebuggerScope);
        Assert(isConst);
        *isPropertyInDebuggerScope = false;

        // Default to writable (for the case of vars and internal properties).
        *isConst = false;

        if (!allowLexicalThis && (propertyId == Js::PropertyIds::_this || propertyId == Js::PropertyIds::_newTarget))
        {
            return false;
        }

        if (!allowSuperReference && (propertyId == Js::PropertyIds::_super || propertyId == Js::PropertyIds::_superConstructor))
        {
            return false;
        }

        if (Js::IsInternalPropertyId(propertyId))
        {
            return false;
        }

        Assert(pFrame);
        Js::FunctionBody *pFBody = pFrame->GetJavascriptFunction()->GetFunctionBody();

        if (pFBody && pFBody->GetScopeObjectChain())
        {
            int offset = GetAdjustedByteCodeOffset();

            if (pFBody->GetScopeObjectChain()->TryGetDebuggerScopePropertyInfo(
                propertyId,
                location,
                offset,
                isPropertyInDebuggerScope,
                isConst,
                isInDeadZone))
            {
                return true;
            }
        }

        // If the register was not found in any scopes, then it's a var and should be in scope.
        return !*isPropertyInDebuggerScope;
    }